

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O2

void sensors_analytics::utils::ObjectNode::DumpNode(ObjectNode *node,string *buffer)

{
  bool bVar1;
  _Base_ptr p_Var2;
  char cVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cVar3 = (char)buffer;
  std::__cxx11::string::push_back(cVar3);
  p_Var2 = (node->properties_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar1 = true;
  while ((_Rb_tree_header *)p_Var2 != &(node->properties_map_)._M_t._M_impl.super__Rb_tree_header) {
    if (!bVar1) {
      std::__cxx11::string::push_back(cVar3);
    }
    std::operator+(&local_70,'\"',
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 1)
                  );
    std::operator+(&local_50,&local_70,"\":");
    std::__cxx11::string::append((string *)buffer);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    ValueNode::ToStr((ValueNode *)(p_Var2 + 2),buffer);
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    bVar1 = false;
  }
  std::__cxx11::string::push_back(cVar3);
  return;
}

Assistant:

void ObjectNode::DumpNode(const ObjectNode &node, string *buffer) {
  *buffer += '{';
  bool first = true;

  for (std::map<string, ValueNode>::const_iterator
           iterator = node.properties_map_.begin();
       iterator != node.properties_map_.end(); ++iterator) {
    if (first) {
      first = false;
    } else {
      *buffer += ',';
    }
    *buffer += '"' + iterator->first + "\":";
    ValueNode::ToStr(iterator->second, buffer);
  }
  *buffer += '}';
}